

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

void Of_ManPrintQuit(Of_Man_t *p)

{
  Vec_Mem_t *pVVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  abctime aVar5;
  abctime time;
  uint uVar6;
  char *in_RSI;
  double dVar7;
  double dVar8;
  float fVar9;
  
  dVar7 = Gia_ManMemory(p->pGia);
  pVVar1 = p->vTtMem;
  if (pVVar1 == (Vec_Mem_t *)0x0) {
    fVar9 = 0.0;
  }
  else {
    uVar6 = 1 << ((byte)pVVar1->LogPageSze & 0x1f);
    in_RSI = (char *)(ulong)uVar6;
    fVar9 = ((float)pVVar1->nPageAlloc * 8.0 +
             (float)(pVVar1->iPage + 1) * (float)(int)uVar6 * (float)pVVar1->nEntrySize * 8.0 + 48.0
            ) * 9.536743e-07;
  }
  iVar4 = p->pGia->nObjs;
  dVar8 = p->CutCount[0];
  if ((dVar8 == 0.0) && (!NAN(dVar8))) {
    p->CutCount[0] = 1.0;
    dVar8 = 1.0;
  }
  if (p->pPars->fVerbose != 0) {
    fVar2 = (float)iVar4 * 32.0 * 9.536743e-07;
    fVar3 = (float)(p->vPages).nSize * 262144.0 * 9.536743e-07;
    printf("CutPair = %.0f  ",dVar8);
    dVar8 = p->CutCount[1];
    iVar4 = Gia_ManAndNum(p->pGia);
    printf("Merge = %.0f (%.1f)  ",dVar8,dVar8 / (double)iVar4);
    dVar8 = p->CutCount[2];
    iVar4 = Gia_ManAndNum(p->pGia);
    printf("Eval = %.0f (%.1f)  ",dVar8,dVar8 / (double)iVar4);
    dVar8 = p->CutCount[3];
    iVar4 = Gia_ManAndNum(p->pGia);
    printf("Cut = %.0f (%.1f)  ",dVar8,dVar8 / (double)iVar4);
    putchar(10);
    printf("Gia = %.2f MB  ",(double)(float)(dVar7 * 9.5367431640625e-07));
    printf("Man = %.2f MB  ",(double)fVar2);
    printf("Cut = %.2f MB   ",(double)fVar3);
    if (p->pPars->fCutMin != 0) {
      printf("TT = %.2f MB  ",(double)fVar9);
    }
    printf("Total = %.2f MB   ",
           (double)((float)(dVar7 * 9.5367431640625e-07) + fVar2 + fVar3 + fVar9));
    aVar5 = Abc_Clock();
    Abc_PrintTime((int)aVar5 - (int)p->clkStart,in_RSI,time);
    fflush(_stdout);
    return;
  }
  return;
}

Assistant:

void Of_ManPrintQuit( Of_Man_t * p )
{
    float MemGia  = Gia_ManMemory(p->pGia) / (1<<20);
    float MemMan  = 1.0 * sizeof(Of_Obj_t) * Gia_ManObjNum(p->pGia) / (1<<20);
    float MemCuts = 1.0 * sizeof(int) * (1 << 16) * Vec_PtrSize(&p->vPages) / (1<<20);
    float MemTt   = p->vTtMem ? Vec_MemMemory(p->vTtMem) / (1<<20) : 0;
    if ( p->CutCount[0] == 0 )
        p->CutCount[0] = 1;
    if ( !p->pPars->fVerbose )
        return;
    printf( "CutPair = %.0f  ",         p->CutCount[0] );
    printf( "Merge = %.0f (%.1f)  ",    p->CutCount[1], 1.0*p->CutCount[1]/Gia_ManAndNum(p->pGia) );
    printf( "Eval = %.0f (%.1f)  ",     p->CutCount[2], 1.0*p->CutCount[2]/Gia_ManAndNum(p->pGia) );
    printf( "Cut = %.0f (%.1f)  ",      p->CutCount[3], 1.0*p->CutCount[3]/Gia_ManAndNum(p->pGia) );
//    printf( "Use = %.0f (%.1f)  ",      p->CutCount[4], 1.0*p->CutCount[4]/Gia_ManAndNum(p->pGia) );
//    printf( "Mat = %.0f (%.1f)  ",      p->CutCount[5], 1.0*p->CutCount[5]/Gia_ManAndNum(p->pGia) );
//    printf( "Equ = %d (%.2f %%)  ",     p->nCutUseAll,  100.0*p->nCutUseAll /p->CutCount[0] );
    printf( "\n" );
    printf( "Gia = %.2f MB  ",          MemGia );
    printf( "Man = %.2f MB  ",          MemMan ); 
    printf( "Cut = %.2f MB   ",         MemCuts );
    if ( p->pPars->fCutMin )
    printf( "TT = %.2f MB  ",           MemTt ); 
    printf( "Total = %.2f MB   ",       MemGia + MemMan + MemCuts + MemTt ); 
//    printf( "\n" );
    Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
    fflush( stdout );
}